

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task32.cpp
# Opt level: O0

double result(string *str)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  reference pvVar6;
  double local_b0;
  double local_a8;
  double local_a0 [3];
  string local_88 [8];
  string tok;
  size_t pos;
  stack<double,_std::deque<double,_std::allocator<double>_>_> temp;
  string *str_local;
  
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_node = (_Map_pointer)str;
  std::stack<double,std::deque<double,std::allocator<double>>>::
  stack<std::deque<double,std::allocator<double>>,void>
            ((stack<double,std::deque<double,std::allocator<double>>> *)&pos);
  while( true ) {
    lVar4 = std::__cxx11::string::find((char)str,0x20);
    if (lVar4 == -1) break;
    std::__cxx11::string::substr((ulong)local_88,(ulong)str);
    bVar2 = is_num(local_88);
    if (bVar2) {
      iVar3 = std::__cxx11::stoi(local_88,(size_t *)0x0,10);
      local_a0[0] = (double)iVar3;
      std::stack<double,_std::deque<double,_std::allocator<double>_>_>::push
                ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&pos,local_a0);
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_88);
      local_a8 = do_oper((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&pos,*pcVar5
                        );
      std::stack<double,_std::deque<double,_std::allocator<double>_>_>::push
                ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&pos,&local_a8);
    }
    std::__cxx11::string::erase((ulong)str,0);
    std::__cxx11::string::~string((string *)local_88);
  }
  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)str);
  local_b0 = do_oper((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&pos,*pcVar5);
  std::stack<double,_std::deque<double,_std::allocator<double>_>_>::push
            ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&pos,&local_b0);
  pvVar6 = std::stack<double,_std::deque<double,_std::allocator<double>_>_>::top
                     ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&pos);
  vVar1 = *pvVar6;
  std::stack<double,_std::deque<double,_std::allocator<double>_>_>::~stack
            ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&pos);
  return vVar1;
}

Assistant:

double result (string str) {
    stack<double> temp;
    size_t pos = 0;
    while ((pos = str.find(' ')) != string::npos){
        string tok = str.substr(0, pos);
        if (is_num(tok)) temp.push(stoi(tok));
        else temp.push(do_oper(temp, tok[0]));
        str.erase(0, pos + 1);
    }
    temp.push(do_oper(temp, str[0]));
    return temp.top();
}